

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerSettings.cpp
# Opt level: O2

void __thiscall OneWireAnalyzerSettings::LoadSettings(OneWireAnalyzerSettings *this,char *settings)

{
  int iVar1;
  SimpleArchive text_archive;
  char *name_string;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&name_string);
  iVar1 = strcmp(name_string,"SaleaeOneWireAnalyzer");
  if (iVar1 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeOneWireAnalyzer: Provided with a settings string that doesn\'t belong to us;")
    ;
  }
  SimpleArchive::operator>>(&text_archive,&this->mOneWireChannel);
  SimpleArchive::operator>>(&text_archive,&this->mOverdrive);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mOneWireChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void OneWireAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeOneWireAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeOneWireAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mOneWireChannel;
    text_archive >> mOverdrive;

    ClearChannels();
    AddChannel( mOneWireChannel, "1-WIRE", true );

    UpdateInterfacesFromSettings();
}